

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_req_make(httpreq **preq,char *method,size_t m_len,char *scheme,size_t s_len,
                           char *authority,size_t a_len,char *path,size_t p_len)

{
  httpreq *req;
  char *pcVar1;
  CURLcode CVar2;
  
  req = (httpreq *)(*Curl_ccalloc)(1,m_len + 0x90);
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (req == (httpreq *)0x0) {
    req = (httpreq *)0x0;
    goto LAB_00136e42;
  }
  memcpy(req->method,method,m_len);
  if (scheme == (char *)0x0) {
LAB_00136dce:
    if (authority != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(authority,a_len);
      req->authority = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00136e34;
    }
    if (path != (char *)0x0) {
      pcVar1 = (char *)Curl_memdup0(path,p_len);
      req->path = pcVar1;
      if (pcVar1 == (char *)0x0) goto LAB_00136e34;
    }
    Curl_dynhds_init((dynhds *)req,0,0x100000);
    Curl_dynhds_init(&req->trailers,0,0x100000);
    CVar2 = CURLE_OK;
  }
  else {
    pcVar1 = (char *)Curl_memdup0(scheme,s_len);
    req->scheme = pcVar1;
    if (pcVar1 != (char *)0x0) goto LAB_00136dce;
LAB_00136e34:
    Curl_http_req_free(req);
    req = (httpreq *)0x0;
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
LAB_00136e42:
  *preq = req;
  return CVar2;
}

Assistant:

CURLcode Curl_http_req_make(struct httpreq **preq,
                            const char *method, size_t m_len,
                            const char *scheme, size_t s_len,
                            const char *authority, size_t a_len,
                            const char *path, size_t p_len)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(method && m_len);

  req = calloc(1, sizeof(*req) + m_len);
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);
  if(scheme) {
    req->scheme = Curl_memdup0(scheme, s_len);
    if(!req->scheme)
      goto out;
  }
  if(authority) {
    req->authority = Curl_memdup0(authority, a_len);
    if(!req->authority)
      goto out;
  }
  if(path) {
    req->path = Curl_memdup0(path, p_len);
    if(!req->path)
      goto out;
  }
  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result ? NULL : req;
  return result;
}